

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

void __thiscall qclab::qgates::SWAP<double>::SWAP(SWAP<double> *this,int qubit0,int qubit1)

{
  int *piVar1;
  int local_2c;
  int local_28;
  int qubits [2];
  int local_18;
  int local_14;
  int qubit1_local;
  int qubit0_local;
  SWAP<double> *this_local;
  
  local_18 = qubit1;
  local_14 = qubit0;
  _qubit1_local = this;
  QGate2<double>::QGate2(&this->super_QGate2<double>);
  (this->super_QGate2<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0075a7f8;
  piVar1 = std::min<int>(&local_14,&local_18);
  (this->qubits_)._M_elems[0] = *piVar1;
  piVar1 = std::max<int>(&local_14,&local_18);
  (this->qubits_)._M_elems[1] = *piVar1;
  local_2c = local_14;
  local_28 = local_18;
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[6])(this,&local_2c);
  return;
}

Assistant:

SWAP( const int qubit0 , const int qubit1 )
        : qubits_( { std::min( qubit0 , qubit1 ) ,
                     std::max( qubit0 , qubit1 ) } )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }